

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.cxx
# Opt level: O0

string * cmJoinImpl<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *rng,string_view separator,string_view initial)

{
  string_view separator_00;
  bool bVar1;
  const_iterator pvVar2;
  const_iterator pvVar3;
  reference pbVar4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  const_iterator end;
  const_iterator begin;
  allocator<char> local_39;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *rng_local;
  string_view initial_local;
  string_view separator_local;
  string *result;
  
  initial_local._M_len = (size_t)initial._M_str;
  rng_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)initial._M_len;
  initial_local._M_str = (char *)separator._M_len;
  local_38 = rng;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(rng);
  if (bVar1) {
    pvVar2 = std::begin<std::basic_string_view<char,std::char_traits<char>>>
                       ((basic_string_view<char,_std::char_traits<char>_> *)&rng_local);
    pvVar3 = std::end<std::basic_string_view<char,std::char_traits<char>>>
                       ((basic_string_view<char,_std::char_traits<char>_> *)&rng_local);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>
              ((string *)__return_storage_ptr__,pvVar2,pvVar3,&local_39);
    std::allocator<char>::~allocator(&local_39);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::basic_string_view<char,_std::char_traits<char>_>::size
              ((basic_string_view<char,_std::char_traits<char>_> *)&rng_local);
    separator_00._M_str = separator._M_str;
    separator_00._M_len = (size_t)initial_local._M_str;
    getJoinedLength<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (local_38,separator_00);
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    pvVar2 = std::begin<std::basic_string_view<char,std::char_traits<char>>>
                       ((basic_string_view<char,_std::char_traits<char>_> *)&rng_local);
    pvVar3 = std::end<std::basic_string_view<char,std::char_traits<char>>>
                       ((basic_string_view<char,_std::char_traits<char>_> *)&rng_local);
    std::__cxx11::string::append<char_const*,void>((string *)__return_storage_ptr__,pvVar2,pvVar3);
    end = std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    (local_38);
    local_78._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(local_38);
    pbVar4 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&end);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)pbVar4);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&end);
    while (bVar1 = __gnu_cxx::operator!=(&end,&local_78), bVar1) {
      pvVar2 = std::begin<std::basic_string_view<char,std::char_traits<char>>>
                         ((basic_string_view<char,_std::char_traits<char>_> *)&initial_local._M_str)
      ;
      pvVar3 = std::end<std::basic_string_view<char,std::char_traits<char>>>
                         ((basic_string_view<char,_std::char_traits<char>_> *)&initial_local._M_str)
      ;
      std::__cxx11::string::append<char_const*,void>((string *)__return_storage_ptr__,pvVar2,pvVar3)
      ;
      pbVar4 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&end);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)pbVar4);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&end);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmJoinImpl(Range const& rng, cm::string_view separator,
                       cm::string_view initial)
{
  if (rng.empty()) {
    return { std::begin(initial), std::end(initial) };
  }

  std::string result;
  result.reserve(initial.size() + getJoinedLength(rng, separator));
  result.append(std::begin(initial), std::end(initial));

  auto begin = std::begin(rng);
  auto end = std::end(rng);
  result += *begin;

  for (++begin; begin != end; ++begin) {
    result.append(std::begin(separator), std::end(separator));
    result += *begin;
  }

  return result;
}